

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
gms_matcher::GetNB9(vector<int,_std::allocator<int>_> *__return_storage_ptr__,gms_matcher *this,
                   int idx,Size *GridSize)

{
  long lVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int idx_yy;
  long lVar8;
  long lVar9;
  allocator_type local_2d;
  value_type_conflict1 local_2c;
  
  local_2c = -1;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,9,&local_2c,&local_2d);
  iVar3 = idx / GridSize->width;
  iVar4 = idx % GridSize->width;
  iVar5 = iVar3 + -1;
  lVar7 = 0;
  for (lVar6 = -1; lVar6 != 2; lVar6 = lVar6 + 1) {
    lVar1 = lVar6 + iVar3;
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar9 = (long)iVar4 + -1 + lVar8;
      if ((((-1 < lVar9) && (lVar9 < GridSize->width)) && (-1 < lVar1)) &&
         (lVar1 < GridSize->height)) {
        *(int *)((long)piVar2 + lVar8 * 4 + lVar7) =
             GridSize->width * iVar5 + iVar4 + -1 + (int)lVar8;
      }
    }
    lVar7 = lVar7 + 0xc;
    iVar5 = iVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> GetNB9(const int idx, const Size& GridSize) {
		vector<int> NB9(9, -1);

		int idx_x = idx % GridSize.width;
		int idx_y = idx / GridSize.width;

		for (int yi = -1; yi <= 1; yi++)
		{
			for (int xi = -1; xi <= 1; xi++)
			{	
				int idx_xx = idx_x + xi;
				int idx_yy = idx_y + yi;

				if (idx_xx < 0 || idx_xx >= GridSize.width || idx_yy < 0 || idx_yy >= GridSize.height)
					continue;

				NB9[xi + 4 + yi * 3] = idx_xx + idx_yy * GridSize.width;
			}
		}
		return NB9;
	}